

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

bool __thiscall
tinyusdz::Animatable<tinyusdz::value::AssetPath>::get_scalar
          (Animatable<tinyusdz::value::AssetPath> *this,AssetPath *v)

{
  bool bVar1;
  
  if (v != (AssetPath *)0x0) {
    if ((this->_blocked == false) && (this->_has_value == true)) {
      std::__cxx11::string::_M_assign((string *)v);
      std::__cxx11::string::_M_assign((string *)&v->resolved_path_);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool get_scalar(T *v) const {
    if (!v) {
      return false;
    }

    if (is_blocked()) {
      return false;
    } else if (has_value()) {
      (*v) = _value;
      return true;
    }

    // timesamples
    return false;
  }